

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

size_t confidential_commitment_length_from_bytes(uchar *bytes,_Bool ct_value)

{
  uint uVar1;
  int iVar2;
  _Bool ct_value_local;
  uchar *bytes_local;
  
  if (bytes != (uchar *)0x0) {
    uVar1 = (uint)*bytes;
    if (uVar1 == 1) {
      iVar2 = 0x21;
      if (ct_value) {
        iVar2 = 9;
      }
      return (long)iVar2;
    }
    if ((uVar1 - 2 < 2) || (uVar1 - 8 < 4)) {
      return 0x21;
    }
  }
  return 1;
}

Assistant:

static size_t confidential_commitment_length_from_bytes(const unsigned char *bytes,
                                                        bool ct_value)
{
    if (bytes) {
        switch (*bytes) {
        case 1:
            return ct_value ? WALLY_TX_ASSET_CT_VALUE_UNBLIND_LEN : WALLY_TX_ASSET_CT_LEN;
        case WALLY_TX_ASSET_CT_VALUE_PREFIX_A:
        case WALLY_TX_ASSET_CT_VALUE_PREFIX_B:
        case WALLY_TX_ASSET_CT_ASSET_PREFIX_A:
        case WALLY_TX_ASSET_CT_ASSET_PREFIX_B:
        case WALLY_TX_ASSET_CT_NONCE_PREFIX_A:
        case WALLY_TX_ASSET_CT_NONCE_PREFIX_B:
            return WALLY_TX_ASSET_CT_LEN;
        }
    }
    return sizeof(uint8_t);
}